

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_units.cpp
# Opt level: O1

void testBaseLimits(string *tempdir)

{
  ostream *poVar1;
  long *plVar2;
  char *in_RCX;
  int mxh;
  int mxw;
  int local_10;
  int local_c;
  
  exr_set_default_maximum_image_size(0x2a,0x2a);
  exr_get_default_maximum_image_size(&local_c,&local_10);
  if ((local_c == 0x2a) && (local_10 == 0x2a)) {
    exr_set_default_maximum_image_size(0xffffffff,0xffffffff);
    exr_get_default_maximum_image_size(&local_c,&local_10);
    if ((local_c != 0x2a) || (local_10 != 0x2a)) goto LAB_00109610;
    exr_set_default_maximum_image_size(0x54,0xffffffff);
    exr_get_default_maximum_image_size(&local_c,&local_10);
    if ((local_c != 0x2a) || (local_10 != 0x2a)) goto LAB_0010969c;
    exr_set_default_maximum_image_size(0xffffffff,0x54);
    exr_get_default_maximum_image_size(&local_c,&local_10);
    if ((local_c != 0x2a) || (local_10 != 0x2a)) goto LAB_00109728;
    exr_set_default_maximum_tile_size(0x80,0x80);
    exr_get_default_maximum_tile_size(&local_c,&local_10);
    if ((local_c != 0x80) || (local_10 != 0x80)) goto LAB_001097b4;
    exr_set_default_maximum_tile_size(0xffffffff,0xffffffff);
    exr_get_default_maximum_tile_size(&local_c,&local_10);
    if ((local_c != 0x80) || (local_10 != 0x80)) goto LAB_00109840;
    exr_set_default_maximum_tile_size(0x54,0xffffffff);
    exr_get_default_maximum_tile_size(&local_c,&local_10);
    if ((local_c == 0x80) && (local_10 == 0x80)) {
      exr_set_default_maximum_tile_size(0xffffffff,0x54);
      exr_get_default_maximum_tile_size(&local_c,&local_10);
      if ((local_c == 0x80) && (local_10 == 0x80)) {
        exr_set_default_maximum_image_size(0,0);
        exr_set_default_maximum_tile_size(0,0);
        return;
      }
      goto LAB_00109958;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Unable to set_default_maximum_image_size: 42, 42 -> ",0x34);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    plVar2 = (long *)std::ostream::operator<<(poVar1,local_10);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    core_test_fail("false",(char *)0xe5,0x17c200,in_RCX);
LAB_00109610:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Invalid request not ignored to set_default_maximum_image_size: 42, 42 -> ",0x49);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    plVar2 = (long *)std::ostream::operator<<(poVar1,local_10);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    core_test_fail("false",(char *)0xee,0x17c200,in_RCX);
LAB_0010969c:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Invalid request not ignored to set_default_maximum_image_size: 42, 42 -> ",0x49);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    plVar2 = (long *)std::ostream::operator<<(poVar1,local_10);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    core_test_fail("false",(char *)0xf8,0x17c200,in_RCX);
LAB_00109728:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Invalid request not ignored to set_default_maximum_image_size: 42, 42 -> ",0x49);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    plVar2 = (long *)std::ostream::operator<<(poVar1,local_10);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    core_test_fail("false",(char *)0x102,0x17c200,in_RCX);
LAB_001097b4:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Unable to set_default_maximum_tile_size: 128, 128 -> ",0x35);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    plVar2 = (long *)std::ostream::operator<<(poVar1,local_10);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    core_test_fail("false",(char *)0x10b,0x17c200,in_RCX);
LAB_00109840:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Invalid request not ignored to set_default_maximum_image_size: 128, 128 -> ",0x4b);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    plVar2 = (long *)std::ostream::operator<<(poVar1,local_10);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    core_test_fail("false",(char *)0x114,0x17c200,in_RCX);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "Invalid request not ignored to set_default_maximum_image_size: 128, 128 -> ",0x4b);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  plVar2 = (long *)std::ostream::operator<<(poVar1,local_10);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  core_test_fail("false",(char *)0x11d,0x17c200,in_RCX);
LAB_00109958:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "Invalid request not ignored to set_default_maximum_image_size: 128, 128 -> ",0x4b);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  plVar2 = (long *)std::ostream::operator<<(poVar1,local_10);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  core_test_fail("false",(char *)0x126,0x17c200,in_RCX);
  exr_print_context_info(0,0);
  exr_print_context_info(0,0);
  exr_print_context_info(0,1);
  return;
}

Assistant:

void
testBaseLimits (const std::string& tempdir)
{
    int mxw, mxh;
    exr_set_default_maximum_image_size (42, 42);
    exr_get_default_maximum_image_size (&mxw, &mxh);
    if (mxw != 42 || mxh != 42)
    {
        std::cerr << "Unable to set_default_maximum_image_size: 42, 42 -> "
                  << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }
    exr_set_default_maximum_image_size (-1, -1);
    exr_get_default_maximum_image_size (&mxw, &mxh);
    if (mxw != 42 || mxh != 42)
    {
        std::cerr
            << "Invalid request not ignored to set_default_maximum_image_size: 42, 42 -> "
            << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }

    exr_set_default_maximum_image_size (84, -1);
    exr_get_default_maximum_image_size (&mxw, &mxh);
    if (mxw != 42 || mxh != 42)
    {
        std::cerr
            << "Invalid request not ignored to set_default_maximum_image_size: 42, 42 -> "
            << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }

    exr_set_default_maximum_image_size (-1, 84);
    exr_get_default_maximum_image_size (&mxw, &mxh);
    if (mxw != 42 || mxh != 42)
    {
        std::cerr
            << "Invalid request not ignored to set_default_maximum_image_size: 42, 42 -> "
            << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }

    exr_set_default_maximum_tile_size (128, 128);
    exr_get_default_maximum_tile_size (&mxw, &mxh);
    if (mxw != 128 || mxh != 128)
    {
        std::cerr << "Unable to set_default_maximum_tile_size: 128, 128 -> "
                  << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }
    exr_set_default_maximum_tile_size (-1, -1);
    exr_get_default_maximum_tile_size (&mxw, &mxh);
    if (mxw != 128 || mxh != 128)
    {
        std::cerr
            << "Invalid request not ignored to set_default_maximum_image_size: 128, 128 -> "
            << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }
    exr_set_default_maximum_tile_size (84, -1);
    exr_get_default_maximum_tile_size (&mxw, &mxh);
    if (mxw != 128 || mxh != 128)
    {
        std::cerr
            << "Invalid request not ignored to set_default_maximum_image_size: 128, 128 -> "
            << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }
    exr_set_default_maximum_tile_size (-1, 84);
    exr_get_default_maximum_tile_size (&mxw, &mxh);
    if (mxw != 128 || mxh != 128)
    {
        std::cerr
            << "Invalid request not ignored to set_default_maximum_image_size: 128, 128 -> "
            << mxw << ", " << mxh << std::endl;
        EXRCORE_TEST (false);
    }
    exr_set_default_maximum_image_size (0, 0);
    exr_set_default_maximum_tile_size (0, 0);
}